

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaHash.c
# Opt level: O2

void Pla_ManHashCubes(Pla_Man_t *p,Tab_Man_t *pTab)

{
  int Entry;
  Vec_Int_t *vCube;
  int i;
  
  (p->vHashes).nSize = 0;
  Vec_IntGrow(&p->vHashes,(p->vCubes).nSize);
  for (i = 0; i < (p->vCubeLits).nSize; i = i + 1) {
    vCube = Vec_WecEntry(&p->vCubeLits,i);
    Entry = Pla_CubeHashValue(vCube);
    Vec_IntPush(&p->vHashes,Entry);
    Tab_ManHashInsert(pTab,Entry,i,0xffff);
  }
  return;
}

Assistant:

void Pla_ManHashCubes( Pla_Man_t * p, Tab_Man_t * pTab )
{
    Vec_Int_t * vCube; int i, Value;
    Vec_IntClear( &p->vHashes );
    Vec_IntGrow( &p->vHashes, Pla_ManCubeNum(p) );
    Vec_WecForEachLevel( &p->vCubeLits, vCube, i )
    {
        Value = Pla_CubeHashValue(vCube);
        Vec_IntPush( &p->vHashes, Value );
        Tab_ManHashInsert( pTab, Value, i, PLA_LIT_UNUSED );
    }
}